

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O3

void __thiscall
P2Pt::pose_poly<double>::rhos_from_root_ids
          (pose_poly<double> *this,double (*root_ids) [1899],double (*out) [3] [1899],
          uint *out_ts_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  double t;
  ulong uVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined8 in_XMM5_Qb;
  undefined1 auVar16 [16];
  double b [10];
  double local_a8;
  double local_88 [11];
  
  *out_ts_len = 0;
  lVar5 = 0;
  do {
    if ((*root_ids)[lVar5] != 0.0) {
      auVar9._0_8_ = (double)(int)lVar5;
      auVar9._8_8_ = in_XMM5_Qb;
      auVar9 = vfmadd213sd_fma(auVar9,ZEXT816(0x3f513f0e8d344724),ZEXT816(0xbff0000000000000));
      auVar12._0_8_ = (double)((int)lVar5 + 1);
      auVar12._8_8_ = in_XMM5_Qb;
      auVar12 = vfmadd213sd_fma(auVar12,ZEXT816(0x3f513f0e8d344724),ZEXT816(0xbff0000000000000));
      uVar3 = *out_ts_len;
      *out_ts_len = uVar3 + 1;
      local_a8 = fn_t(this,auVar9._0_8_,local_88);
      dVar7 = fn_t(this,auVar12._0_8_,local_88);
      iVar6 = 3;
      dVar8 = auVar9._0_8_;
      dVar15 = auVar12._0_8_;
      do {
        dVar11 = dVar7;
        t = dVar15 + ((dVar8 - dVar15) * dVar11) / (dVar11 - local_a8);
        (*out)[0][uVar3] = t;
        if (iVar6 == 1) break;
        dVar7 = fn_t(this,t,local_88);
        iVar6 = iVar6 + -1;
        dVar8 = dVar15;
        dVar15 = t;
        local_a8 = dVar11;
      } while (iVar6 != 0);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x76b) {
      uVar3 = *out_ts_len;
      if ((ulong)uVar3 != 0) {
        dVar8 = this->alpha;
        uVar4 = 0;
        do {
          dVar15 = (*out)[0][uVar4];
          dVar7 = (dVar8 + dVar8) * dVar15;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = this->beta;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar15 * dVar15;
          auVar12 = vfnmadd213sd_fma(auVar16,auVar13,auVar16);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = this->sth;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = dVar7 * this->cth;
          auVar9 = vfmadd231sd_fma(auVar14,auVar12,auVar1);
          dVar15 = 1.0 / (dVar15 * dVar15 + 1.0);
          (*out)[1][uVar4] = auVar9._0_8_ * dVar15;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = this->cth;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = dVar7 * this->sth;
          auVar9 = vfmsub231sd_fma(auVar10,auVar12,auVar2);
          (*out)[2][uVar4] = auVar9._0_8_ * dVar15;
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      return;
    }
  } while( true );
}

Assistant:

inline void rhos_from_root_ids(
      const T (&root_ids)[ROOT_IDS_LEN], T (*out)[3][ROOT_IDS_LEN], unsigned *out_ts_len) { 
    T (&ts)[ROOT_IDS_LEN] = (*out)[0];
    unsigned &ts_end = *out_ts_len; ts_end = 0;
    for (unsigned i = 0; i < ROOT_IDS_LEN; i++) {
      if (!root_ids[i]) continue;
      T t0 = t_vec(i), t1 = t_vec(i+1), &t2 = ts[ts_end++];
      T f0 = fn_t(t_vec(i)), f1 = fn_t(t_vec(i+1));
      for (unsigned k = 0; k < 3; ++k) {
        t2 = t1 - f1*(t1-t0)/(f1-f0); t0 = t1; t1 = t2;
        f0 = f1; if (k + 1 < 3) f1 = fn_t(t2);
      }
    }
    //% Each root is now ts(i), plus minus t_stddev. Now get rho1(t):
    T (&rhos1)[ROOT_IDS_LEN] = (*out)[1]; T (&rhos2)[ROOT_IDS_LEN] = (*out)[2];
    const T alpha_times_2 = 2.*alpha;
    for (unsigned i = 0; i < ts_end; i++) {
      const T ts_new = ts[i],
      x2 = ts_new * ts_new,
      ts_den = 1. + x2,
      alpha_ts_new2 = alpha_times_2 * ts_new,
      beta_1_minus_x2 = beta * (1. - x2);
      rhos1[i] = ( alpha_ts_new2 * cth + beta_1_minus_x2 * sth) / ts_den;
      rhos2[i] = (-alpha_ts_new2 * sth + beta_1_minus_x2 * cth) / ts_den;
    }
  }